

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O2

void __thiscall
MT32Emu::LA32FloatPartialPair::deactivate(LA32FloatPartialPair *this,PairType useMaster)

{
  if (useMaster != MASTER) {
    (this->slave).active = false;
    this->slaveOutputSample = 0.0;
    return;
  }
  (this->master).active = false;
  this->masterOutputSample = 0.0;
  return;
}

Assistant:

void LA32FloatPartialPair::deactivate(const PairType useMaster) {
	if (useMaster == MASTER) {
		master.deactivate();
		masterOutputSample = 0.0f;
	} else {
		slave.deactivate();
		slaveOutputSample = 0.0f;
	}
}